

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

Filter * __thiscall
helics::ConnectorFederateManager::getFilter(ConnectorFederateManager *this,string_view name)

{
  bool bVar1;
  undefined1 *puVar2;
  handle filts;
  BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
  filt;
  handle local_60;
  BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
  local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_60,&this->filters);
  gmlc::containers::
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  ::find(&local_48,local_60.data,name);
  gmlc::containers::
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  ::end(&local_30,&(local_60.data)->dataStorage);
  bVar1 = gmlc::containers::
          BlockIterator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,32,std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>**>
          ::operator!=((BlockIterator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,32,std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>**>
                        *)&local_48,&local_30);
  if (bVar1) {
    puVar2 = (undefined1 *)
             ((local_48.ptr)->_M_t).
             super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
             super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
             super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
  }
  else {
    puVar2 = invalidFiltNC;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_60.m_handle_lock);
  return (Filter *)puVar2;
}

Assistant:

Filter& ConnectorFederateManager::getFilter(std::string_view name)
{
    auto filts = filters.lock();
    auto filt = filts->find(name);
    return (filt != filts.end()) ? (**filt) : invalidFiltNC;
}